

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int ParseFilterHeader(VP8BitReader *br,VP8Decoder *dec)

{
  uint32_t uVar1;
  int32_t iVar2;
  long in_RSI;
  long in_RDI;
  int i;
  VP8FilterHeader *hdr;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  *(uint32_t *)(in_RSI + 0x50) = uVar1;
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  *(uint32_t *)(in_RSI + 0x54) = uVar1;
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  *(uint32_t *)(in_RSI + 0x58) = uVar1;
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  *(uint32_t *)(in_RSI + 0x5c) = uVar1;
  if ((*(int *)(in_RSI + 0x5c) != 0) &&
     (uVar1 = VP8GetValue((VP8BitReader *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc), uVar1 != 0)) {
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      if (uVar1 != 0) {
        iVar2 = VP8GetSignedValue((VP8BitReader *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc);
        *(int32_t *)(in_RSI + 0x60 + (long)iVar4 * 4) = iVar2;
      }
    }
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      if (uVar1 != 0) {
        iVar2 = VP8GetSignedValue((VP8BitReader *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc);
        *(int32_t *)(in_RSI + 0x70 + (long)iVar4 * 4) = iVar2;
      }
    }
  }
  if (*(int *)(in_RSI + 0x54) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 2;
    if (*(uint32_t *)(in_RSI + 0x50) != 0) {
      uVar3 = 1;
    }
  }
  *(undefined4 *)(in_RSI + 0xb68) = uVar3;
  return (int)((*(int *)(in_RDI + 0x28) != 0 ^ 0xffU) & 1);
}

Assistant:

static int ParseFilterHeader(VP8BitReader* br, VP8Decoder* const dec) {
  VP8FilterHeader* const hdr = &dec->filter_hdr_;
  hdr->simple_    = VP8Get(br, "global-header");
  hdr->level_     = VP8GetValue(br, 6, "global-header");
  hdr->sharpness_ = VP8GetValue(br, 3, "global-header");
  hdr->use_lf_delta_ = VP8Get(br, "global-header");
  if (hdr->use_lf_delta_) {
    if (VP8Get(br, "global-header")) {   // update lf-delta?
      int i;
      for (i = 0; i < NUM_REF_LF_DELTAS; ++i) {
        if (VP8Get(br, "global-header")) {
          hdr->ref_lf_delta_[i] = VP8GetSignedValue(br, 6, "global-header");
        }
      }
      for (i = 0; i < NUM_MODE_LF_DELTAS; ++i) {
        if (VP8Get(br, "global-header")) {
          hdr->mode_lf_delta_[i] = VP8GetSignedValue(br, 6, "global-header");
        }
      }
    }
  }
  dec->filter_type_ = (hdr->level_ == 0) ? 0 : hdr->simple_ ? 1 : 2;
  return !br->eof_;
}